

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O0

void __thiscall
HighsCliqueTable::buildFrom(HighsCliqueTable *this,HighsLp *origModel,HighsCliqueTable *init)

{
  int iVar1;
  size_type sVar2;
  const_reference pvVar3;
  long in_RDX;
  long in_RDI;
  HighsInt origin;
  HighsInt numvars;
  HighsInt i;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> clqBuffer;
  HighsInt ncliques;
  HighsCliqueTable newCliqueTable;
  HighsInt ncols;
  HighsCliqueTable *in_stack_fffffffffffffd08;
  HighsCliqueTable *in_stack_fffffffffffffd10;
  CliqueVar *in_stack_fffffffffffffd18;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
  *in_stack_fffffffffffffd20;
  iterator in_stack_fffffffffffffd28;
  const_iterator in_stack_fffffffffffffd30;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd40;
  HighsInt HVar4;
  undefined4 in_stack_fffffffffffffd44;
  const_iterator in_stack_fffffffffffffda8;
  __normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  in_stack_fffffffffffffdb0;
  int local_234;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> local_230;
  int local_218;
  HighsInt in_stack_fffffffffffffe2c;
  undefined1 in_stack_fffffffffffffe33;
  HighsInt in_stack_fffffffffffffe34;
  CliqueVar *in_stack_fffffffffffffe38;
  _Head_base<0UL,_HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>_*,_false>
  in_stack_fffffffffffffe40;
  
  std::vector<int,_std::allocator<int>_>::size
            ((vector<int,_std::allocator<int>_> *)(in_RDX + 0x100));
  HighsCliqueTable((HighsCliqueTable *)in_stack_fffffffffffffdb0._M_current,
                   (HighsInt)((ulong)in_stack_fffffffffffffda8._M_current >> 0x20));
  setPresolveFlag((HighsCliqueTable *)&stack0xfffffffffffffdf8,(bool)(*(byte *)(in_RDI + 0x1d8) & 1)
                 );
  setPresolveFlag((HighsCliqueTable *)&stack0xfffffffffffffdf8,*(int *)(in_RDI + 0x1d4) != 0);
  sVar2 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::size
                    ((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_> *)
                     (in_RDX + 0xb8));
  local_218 = (int)sVar2;
  std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::vector
            ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *)
             0x53e9aa);
  std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::reserve
            ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *)
             CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
             (size_type)in_stack_fffffffffffffd38._M_current);
  for (local_234 = 0; local_234 != local_218; local_234 = local_234 + 1) {
    pvVar3 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
             operator[]((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                         *)(in_RDX + 0xb8),(long)local_234);
    if (pvVar3->start != -1) {
      pvVar3 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
               operator[]((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                           *)(in_RDX + 0xb8),(long)local_234);
      HVar4 = pvVar3->end;
      pvVar3 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
               operator[]((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                           *)(in_RDX + 0xb8),(long)local_234);
      iVar1 = HVar4 - pvVar3->start;
      pvVar3 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
               operator[]((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                           *)(in_RDX + 0xb8),(long)local_234);
      if (1 < iVar1 - pvVar3->numZeroFixed) {
        std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
        begin(&in_stack_fffffffffffffd08->cliqueentries);
        std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::operator[]
                  ((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_> *)
                   (in_RDX + 0xb8),(long)local_234);
        __gnu_cxx::
        __normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
        ::operator+((__normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                     *)in_stack_fffffffffffffd18,(difference_type)in_stack_fffffffffffffd10);
        in_stack_fffffffffffffda8 =
             std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
             ::begin(&in_stack_fffffffffffffd08->cliqueentries);
        std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::operator[]
                  ((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_> *)
                   (in_RDX + 0xb8),(long)local_234);
        in_stack_fffffffffffffdb0 =
             __gnu_cxx::
             __normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
             ::operator+(in_stack_fffffffffffffd18,(difference_type)in_stack_fffffffffffffd10);
        std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
        assign<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar_const*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,void>
                  (in_stack_fffffffffffffd20,
                   (__normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                    )in_stack_fffffffffffffd30._M_current,
                   (__normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                    )in_stack_fffffffffffffd28._M_current);
        in_stack_fffffffffffffd30._M_current = (CliqueVar *)&local_230;
        std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
        begin(&in_stack_fffffffffffffd08->cliqueentries);
        std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::end
                  (&in_stack_fffffffffffffd08->cliqueentries);
        in_stack_fffffffffffffd38 =
             std::
             remove_if<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::buildFrom(HighsLp_const*,HighsCliqueTable_const&)::__0>
                       (in_stack_fffffffffffffd38,in_stack_fffffffffffffd30._M_current,
                        in_stack_fffffffffffffd28._M_current);
        __gnu_cxx::
        __normal_iterator<HighsCliqueTable::CliqueVar_const*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>
        ::__normal_iterator<HighsCliqueTable::CliqueVar*>
                  ((__normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                    *)in_stack_fffffffffffffd10,
                   (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                    *)in_stack_fffffffffffffd08);
        in_stack_fffffffffffffd20 = &local_230;
        std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::end
                  (&in_stack_fffffffffffffd08->cliqueentries);
        __gnu_cxx::
        __normal_iterator<HighsCliqueTable::CliqueVar_const*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>
        ::__normal_iterator<HighsCliqueTable::CliqueVar*>
                  ((__normal_iterator<const_HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                    *)in_stack_fffffffffffffd10,
                   (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                    *)in_stack_fffffffffffffd08);
        in_stack_fffffffffffffd28 =
             std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
             ::erase(in_stack_fffffffffffffd28._M_current,in_stack_fffffffffffffd38._M_current,
                     in_stack_fffffffffffffd30);
        sVar2 = std::
                vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
                size(&local_230);
        if (1 < sVar2) {
          std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
          operator[]((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_> *)
                     (in_RDX + 0xb8),(long)local_234);
          in_stack_fffffffffffffd10 = (HighsCliqueTable *)&local_230;
          in_stack_fffffffffffffd18 =
               std::
               vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
               data((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     *)0x53ecab);
          std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
          size(&in_stack_fffffffffffffd10->cliqueentries);
          doAddClique((HighsCliqueTable *)in_stack_fffffffffffffe40._M_head_impl,
                      in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
                      (bool)in_stack_fffffffffffffe33,in_stack_fffffffffffffe2c);
        }
      }
    }
  }
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdb0._M_current,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffda8._M_current);
  std::vector<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>::
  operator=((vector<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
             *)in_stack_fffffffffffffdb0._M_current,
            (vector<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
             *)in_stack_fffffffffffffda8._M_current);
  operator=(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::~vector
            (in_stack_fffffffffffffd20);
  ~HighsCliqueTable(in_stack_fffffffffffffd10);
  return;
}

Assistant:

void HighsCliqueTable::buildFrom(const HighsLp* origModel,
                                 const HighsCliqueTable& init) {
  assert(init.colsubstituted.size() == colsubstituted.size());
  HighsInt ncols = init.colsubstituted.size();
  HighsCliqueTable newCliqueTable(ncols);
  newCliqueTable.setPresolveFlag(inPresolve);
  newCliqueTable.setPresolveFlag(minEntriesForParallelism);
  HighsInt ncliques = init.cliques.size();
  std::vector<CliqueVar> clqBuffer;
  clqBuffer.reserve(2 * static_cast<size_t>(origModel->num_col_));
  for (HighsInt i = 0; i != ncliques; ++i) {
    if (init.cliques[i].start == -1) continue;

    HighsInt numvars = init.cliques[i].end - init.cliques[i].start;

    if (numvars - init.cliques[i].numZeroFixed <= 1) continue;

    clqBuffer.assign(init.cliqueentries.begin() + init.cliques[i].start,
                     init.cliqueentries.begin() + init.cliques[i].end);
    clqBuffer.erase(std::remove_if(clqBuffer.begin(), clqBuffer.end(),
                                   [origModel](CliqueVar v) {
                                     return origModel->col_lower_[v.col] !=
                                                0.0 ||
                                            origModel->col_upper_[v.col] != 1.0;
                                   }),
                    clqBuffer.end());
    if (clqBuffer.size() <= 1) continue;

    HighsInt origin = init.cliques[i].origin != kHighsIInf ? -1 : kHighsIInf;
    newCliqueTable.doAddClique(clqBuffer.data(), clqBuffer.size(), false,
                               origin);
  }

  newCliqueTable.colsubstituted = init.colsubstituted;
  newCliqueTable.substitutions = init.substitutions;
  *this = std::move(newCliqueTable);
}